

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::iterate(CompressedSubImageTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  int iVar38;
  ContextType ctxType;
  int iVar39;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  
  iVar38 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    bVar1 = Test<1u>(this,0x84ed);
    bVar2 = Test<2u>(this,0x8dbb);
    bVar3 = Test<2u>(this,0x8dbc);
    bVar4 = Test<2u>(this,0x8dbd);
    bVar5 = Test<2u>(this,0x8dbe);
    bVar6 = Test<2u>(this,0x8e8c);
    bVar7 = Test<2u>(this,0x8e8d);
    bVar8 = Test<2u>(this,0x8e8e);
    bVar9 = Test<2u>(this,0x8e8f);
    bVar10 = Test<2u>(this,0x9274);
    bVar11 = Test<2u>(this,0x9275);
    bVar12 = Test<2u>(this,0x9276);
    bVar13 = Test<2u>(this,0x9277);
    bVar14 = Test<2u>(this,0x9278);
    bVar15 = Test<2u>(this,0x9279);
    bVar16 = Test<2u>(this,0x9270);
    bVar17 = Test<2u>(this,0x9271);
    bVar18 = Test<2u>(this,0x9272);
    bVar19 = Test<2u>(this,0x9273);
    bVar20 = Test<3u>(this,0x8dbb);
    bVar21 = Test<3u>(this,0x8dbc);
    bVar22 = Test<3u>(this,0x8dbd);
    bVar23 = Test<3u>(this,0x8dbe);
    bVar24 = Test<3u>(this,0x8e8c);
    bVar25 = Test<3u>(this,0x8e8d);
    bVar26 = Test<3u>(this,0x8e8e);
    bVar27 = Test<3u>(this,0x8e8f);
    bVar28 = Test<3u>(this,0x9274);
    bVar29 = Test<3u>(this,0x9275);
    bVar30 = Test<3u>(this,0x9276);
    bVar31 = Test<3u>(this,0x9277);
    bVar32 = Test<3u>(this,0x9278);
    bVar33 = Test<3u>(this,0x9279);
    bVar34 = Test<3u>(this,0x9270);
    bVar35 = Test<3u>(this,0x9271);
    bVar36 = Test<3u>(this,0x9272);
    bVar37 = Test<3u>(this,0x9273);
    CleanAll(this);
    do {
      iVar39 = (**(code **)(CONCAT44(extraout_var,iVar38) + 0x800))();
    } while (iVar39 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((((((((bVar30 && bVar31) && bVar32) && bVar33) && bVar34) && bVar35) && bVar36) && bVar37)
        && (((((((bVar23 && bVar24) && bVar25) && bVar26) && bVar27) && bVar28) && bVar29) &&
           ((((((bVar17 && bVar18) && bVar19) && bVar20) && bVar21) && bVar22) &&
           (((((bVar12 && bVar13) && bVar14) && bVar15) && bVar16) &&
           ((((bVar8 && bVar9) && bVar10) && bVar11) &&
           (((bVar5 && bVar6) && bVar7) && ((bVar3 && bVar4) && (bVar1 && bVar2)))))))) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CompressedSubImageTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		is_ok &= Test<1>(GL_COMPRESSED_RGB);

		is_ok &= Test<2>(GL_COMPRESSED_RED_RGTC1);
		is_ok &= Test<2>(GL_COMPRESSED_SIGNED_RED_RGTC1);
		is_ok &= Test<2>(GL_COMPRESSED_RG_RGTC2);
		is_ok &= Test<2>(GL_COMPRESSED_SIGNED_RG_RGTC2);
		is_ok &= Test<2>(GL_COMPRESSED_RGBA_BPTC_UNORM);
		is_ok &= Test<2>(GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM);
		is_ok &= Test<2>(GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT);
		is_ok &= Test<2>(GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT);
		is_ok &= Test<2>(GL_COMPRESSED_RGB8_ETC2);
		is_ok &= Test<2>(GL_COMPRESSED_SRGB8_ETC2);
		is_ok &= Test<2>(GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2);
		is_ok &= Test<2>(GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2);
		is_ok &= Test<2>(GL_COMPRESSED_RGBA8_ETC2_EAC);
		is_ok &= Test<2>(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);
		is_ok &= Test<2>(GL_COMPRESSED_R11_EAC);
		is_ok &= Test<2>(GL_COMPRESSED_SIGNED_R11_EAC);
		is_ok &= Test<2>(GL_COMPRESSED_RG11_EAC);
		is_ok &= Test<2>(GL_COMPRESSED_SIGNED_RG11_EAC);

		is_ok &= Test<3>(GL_COMPRESSED_RED_RGTC1);
		is_ok &= Test<3>(GL_COMPRESSED_SIGNED_RED_RGTC1);
		is_ok &= Test<3>(GL_COMPRESSED_RG_RGTC2);
		is_ok &= Test<3>(GL_COMPRESSED_SIGNED_RG_RGTC2);
		is_ok &= Test<3>(GL_COMPRESSED_RGBA_BPTC_UNORM);
		is_ok &= Test<3>(GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM);
		is_ok &= Test<3>(GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT);
		is_ok &= Test<3>(GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT);
		is_ok &= Test<3>(GL_COMPRESSED_RGB8_ETC2);
		is_ok &= Test<3>(GL_COMPRESSED_SRGB8_ETC2);
		is_ok &= Test<3>(GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2);
		is_ok &= Test<3>(GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2);
		is_ok &= Test<3>(GL_COMPRESSED_RGBA8_ETC2_EAC);
		is_ok &= Test<3>(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);
		is_ok &= Test<3>(GL_COMPRESSED_R11_EAC);
		is_ok &= Test<3>(GL_COMPRESSED_SIGNED_R11_EAC);
		is_ok &= Test<3>(GL_COMPRESSED_RG11_EAC);
		is_ok &= Test<3>(GL_COMPRESSED_SIGNED_RG11_EAC);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	CleanAll();

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}